

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.cc
# Opt level: O1

uint32_t crc32_8(void *data,size_t len,uint32_t prev_value)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  uint32_t *cur;
  
  uVar3 = ~prev_value;
  if (7 < len) {
    do {
      uVar3 = uVar3 ^ *data;
      uVar1 = *(uint *)((long)data + 4);
      data = (void *)((long)data + 8);
      uVar3 = crc_lookup[6][uVar3 >> 8 & 0xff] ^ crc_lookup[7][uVar3 & 0xff] ^
              *(uint *)((long)crc_lookup[5] + (ulong)(uVar3 >> 0xe & 0x3fc)) ^
              crc_lookup[4][uVar3 >> 0x18] ^ crc_lookup[3][uVar1 & 0xff] ^
              crc_lookup[2][uVar1 >> 8 & 0xff] ^
              *(uint *)((long)crc_lookup[1] + (ulong)(uVar1 >> 0xe & 0x3fc)) ^
              crc_lookup[0][uVar1 >> 0x18];
      len = len - 8;
    } while (7 < len);
  }
  if (len != 0) {
    sVar2 = 0;
    do {
      uVar3 = uVar3 >> 8 ^ crc_lookup[0][(uint)*(byte *)((long)data + sVar2) ^ uVar3 & 0xff];
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  return ~uVar3;
}

Assistant:

uint32_t crc32_8(const void* data, size_t len, uint32_t prev_value)
{
    uint32_t *cur = (uint32_t*) data;
    uint32_t crc = ~prev_value;

    while (len >= 8) {
#ifdef _BIG_ENDIAN
        uint32_t one = *cur++ ^ bitswap32(crc);
        uint32_t two = *cur++;
        crc =
            crc_lookup[7][(one>>24) & 0xFF] ^
            crc_lookup[6][(one>>16) & 0xFF] ^
            crc_lookup[5][(one>> 8) & 0xFF] ^
            crc_lookup[4][(one    ) & 0xFF] ^
            crc_lookup[3][(two>>24) & 0xFF] ^
            crc_lookup[2][(two>>16) & 0xFF] ^
            crc_lookup[1][(two>> 8) & 0xFF] ^
            crc_lookup[0][(two    ) & 0xFF];
#else
        uint32_t one = *cur++ ^ crc;
        uint32_t two = *cur++;
        crc =
            crc_lookup[7][(one    ) & 0xFF] ^
            crc_lookup[6][(one>> 8) & 0xFF] ^
            crc_lookup[5][(one>>16) & 0xFF] ^
            crc_lookup[4][(one>>24) & 0xFF] ^
            crc_lookup[3][(two    ) & 0xFF] ^
            crc_lookup[2][(two>> 8) & 0xFF] ^
            crc_lookup[1][(two>>16) & 0xFF] ^
            crc_lookup[0][(two>>24) & 0xFF];
#endif
        len -= 8;
    }

    unsigned char *cur_byte = (unsigned char*) cur;
    while (len--)
        crc = (crc >> 8) ^ crc_lookup[0][(crc & 0xFF) ^ *cur_byte++];

    return ~crc;
}